

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

nng_err nni_http_handler_init_file_ctype(nni_http_handler **hpp,char *uri,char *path,char *ctype)

{
  nng_err nVar1;
  void *data;
  char *pcVar2;
  nni_http_handler *local_40;
  nni_http_handler *h;
  
  h = (nni_http_handler *)hpp;
  data = nni_zalloc(0x18);
  nVar1 = NNG_ENOMEM;
  if (data != (void *)0x0) {
    if (ctype == (char *)0x0) {
      pcVar2 = http_lookup_type(path);
      ctype = "application/octet-stream";
      if (pcVar2 != (char *)0x0) {
        ctype = pcVar2;
      }
    }
    pcVar2 = nni_strdup(path);
    *(char **)((long)data + 8) = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = nni_strdup(ctype);
      *(char **)((long)data + 0x10) = pcVar2;
      if ((pcVar2 != (char *)0x0) &&
         (nVar1 = nni_http_handler_init(&local_40,uri,http_handle_file), nVar1 == NNG_OK)) {
        nni_http_handler_set_data(local_40,data,http_file_free);
        local_40->getbody = true;
        local_40->maxbody = 0;
        (h->node).ln_next = &local_40->node;
        return NNG_OK;
      }
    }
    http_file_free(data);
  }
  return nVar1;
}

Assistant:

nng_err
nni_http_handler_init_file_ctype(nni_http_handler **hpp, const char *uri,
    const char *path, const char *ctype)
{
	nni_http_handler *h;
	http_file        *hf;
	nng_err           rv;

	if ((hf = NNI_ALLOC_STRUCT(hf)) == NULL) {
		return (NNG_ENOMEM);
	}

	// Later we might want to do this in the server side, if we support
	// custom media type lists on a per-server basis.  For now doing this
	// here ensures that we don't have to lookup the type every time.
	if (ctype == NULL) {
		if ((ctype = http_lookup_type(path)) == NULL) {
			ctype = "application/octet-stream";
		}
	}
	if (((hf->path = nni_strdup(path)) == NULL) ||
	    ((hf->ctype = nni_strdup(ctype)) == NULL)) {
		http_file_free(hf);
		return (NNG_ENOMEM);
	}

	if ((rv = nni_http_handler_init(&h, uri, http_handle_file)) != 0) {
		http_file_free(hf);
		return (rv);
	}

	nni_http_handler_set_data(h, hf, http_file_free);

	// We don't permit a body for getting a file.
	nni_http_handler_collect_body(h, true, 0);

	*hpp = h;
	return (NNG_OK);
}